

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O3

void __thiscall
chrono::ChIntegrableIIorder::StateGatherDerivative(ChIntegrableIIorder *this,ChStateDelta *Dydt)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Index size;
  ulong uVar14;
  Index index;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ChStateDelta ma;
  ChStateDelta mv;
  ChStateDelta local_48;
  ChStateDelta local_30;
  
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])();
  ChStateDelta::ChStateDelta(&local_30,(long)iVar11,Dydt->integrable);
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_48,(long)iVar11,Dydt->integrable);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x18])(this,&local_48);
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  pdVar3 = (Dydt->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (iVar11 < 0 && pdVar3 != (double *)0x0) {
LAB_0086f19d:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if ((iVar11 < 0) ||
     (uVar14 = (ulong)iVar11,
     (Dydt->super_ChVectorDynamic<double>).
     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < (long)uVar14)
     ) {
LAB_0086f1bc:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  if (local_30.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar14) {
LAB_0086f1db:
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                 );
  }
  uVar15 = uVar14;
  if ((((ulong)pdVar3 & 7) == 0) &&
     (uVar15 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar14 <= uVar15)) {
    uVar15 = uVar14;
  }
  iVar11 = (int)(uVar14 - uVar15);
  iVar16 = iVar11 + 7;
  if (-1 < iVar11) {
    iVar16 = iVar11;
  }
  if (uVar15 != 0) {
    uVar18 = 0;
    do {
      pdVar3[uVar18] =
           local_30.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  uVar18 = uVar15 + (long)(iVar16 >> 3) * 8;
  if (7 < (long)(uVar14 - uVar15)) {
    do {
      pdVar1 = local_30.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar15;
      dVar4 = pdVar1[1];
      dVar5 = pdVar1[2];
      dVar6 = pdVar1[3];
      dVar7 = pdVar1[4];
      dVar8 = pdVar1[5];
      dVar9 = pdVar1[6];
      dVar10 = pdVar1[7];
      pdVar2 = pdVar3 + uVar15;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar4;
      pdVar2[2] = dVar5;
      pdVar2[3] = dVar6;
      pdVar2[4] = dVar7;
      pdVar2[5] = dVar8;
      pdVar2[6] = dVar9;
      pdVar2[7] = dVar10;
      uVar15 = uVar15 + 8;
    } while ((long)uVar15 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar14) {
    do {
      pdVar3[uVar18] =
           local_30.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar14 != uVar18);
  }
  uVar12 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  uVar13 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  pdVar3 = (Dydt->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if ((int)uVar13 < 0 && pdVar3 != (double *)0x0) goto LAB_0086f19d;
  uVar14 = (ulong)(int)uVar13;
  if (((int)(uVar13 | uVar12) < 0) ||
     ((long)((Dydt->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
            uVar14) < (long)(int)uVar12)) goto LAB_0086f1bc;
  if (local_48.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar14)
  goto LAB_0086f1db;
  pdVar3 = pdVar3 + (int)uVar12;
  uVar15 = uVar14;
  if ((((ulong)pdVar3 & 7) == 0) &&
     (uVar15 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), (long)uVar14 <= (long)uVar15
     )) {
    uVar15 = uVar14;
  }
  uVar17 = uVar14 - uVar15;
  uVar18 = uVar17 + 7;
  if (-1 < (long)uVar17) {
    uVar18 = uVar17;
  }
  if (0 < (long)uVar15) {
    uVar19 = 0;
    do {
      pdVar3[uVar19] =
           local_48.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
  }
  uVar18 = (uVar18 & 0xfffffffffffffff8) + uVar15;
  if (7 < (long)uVar17) {
    do {
      pdVar1 = local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar15;
      dVar4 = pdVar1[1];
      dVar5 = pdVar1[2];
      dVar6 = pdVar1[3];
      dVar7 = pdVar1[4];
      dVar8 = pdVar1[5];
      dVar9 = pdVar1[6];
      dVar10 = pdVar1[7];
      pdVar2 = pdVar3 + uVar15;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar4;
      pdVar2[2] = dVar5;
      pdVar2[3] = dVar6;
      pdVar2[4] = dVar7;
      pdVar2[5] = dVar8;
      pdVar2[6] = dVar9;
      pdVar2[7] = dVar10;
      uVar15 = uVar15 + 8;
    } while ((long)uVar15 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar14) {
    do {
      pdVar3[uVar18] =
           local_48.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar14 != uVar18);
  }
  else if (local_48.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
           (double *)0x0) goto LAB_0086f17b;
  free((void *)local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]);
LAB_0086f17b:
  if (local_30.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_30.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  return;
}

Assistant:

void ChIntegrableIIorder::StateGatherDerivative(ChStateDelta& Dydt) {
    ChStateDelta mv(GetNcoords_v(), Dydt.GetIntegrable());
    ChStateDelta ma(GetNcoords_v(), Dydt.GetIntegrable());
    StateGatherAcceleration(ma);
    Dydt.segment(0, GetNcoords_v()) = mv;
    Dydt.segment(GetNcoords_v(), GetNcoords_v()) = ma;
}